

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O2

ExprTree * __thiscall PcodeCompile::createLoad(PcodeCompile *this,StarQuality *qual,ExprTree *ptr)

{
  VarnodeTpl *vt;
  OpTpl *this_00;
  VarnodeTpl *pVVar1;
  OpTpl *op;
  ConstTpl local_70;
  ConstTpl local_50;
  
  vt = buildTemporary(this);
  this_00 = (OpTpl *)operator_new(0x28);
  (this_00->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->opc = CPUI_LOAD;
  this_00->output = (VarnodeTpl *)0x0;
  op = this_00;
  pVVar1 = (VarnodeTpl *)operator_new(0x68);
  ConstTpl::ConstTpl(&local_70,this->constantspace);
  ConstTpl::ConstTpl(&local_50,real,8);
  VarnodeTpl::VarnodeTpl(pVVar1,&local_70,&qual->id,&local_50);
  OpTpl::addInput(this_00,pVVar1);
  OpTpl::addInput(this_00,ptr->outvn);
  this_00->output = vt;
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::push_back(ptr->ops,&op);
  if ((ulong)qual->size != 0) {
    ConstTpl::ConstTpl(&local_70,real,(ulong)qual->size);
    force_size(vt,&local_70,ptr->ops);
  }
  pVVar1 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(pVVar1,vt);
  ptr->outvn = pVVar1;
  operator_delete(qual);
  return ptr;
}

Assistant:

ExprTree *PcodeCompile::createLoad(StarQuality *qual,ExprTree *ptr)

{				// Create new load expression, free ptr expression
  VarnodeTpl *outvn = buildTemporary();
  OpTpl *op = new OpTpl(CPUI_LOAD);
  // The first varnode input to the load is a constant reference to the AddrSpace being loaded
  // from.  Internally, we really store the pointer to the AddrSpace as the reference, but this
  // isn't platform independent. So officially, we assume that the constant reference will be the
  // AddrSpace index.  We can safely assume this always has size 4.
  VarnodeTpl *spcvn = new VarnodeTpl(ConstTpl(constantspace),
				     qual->id,
				     ConstTpl(ConstTpl::real,8));
  op->addInput(spcvn);
  op->addInput(ptr->outvn);
  op->setOutput(outvn);
  ptr->ops->push_back(op);
  if (qual->size > 0)
    force_size(outvn,ConstTpl(ConstTpl::real,qual->size),*ptr->ops);
  ptr->outvn = new VarnodeTpl(*outvn);
  delete qual;
  return ptr;
}